

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# component.cpp
# Opt level: O0

VariablePtr __thiscall libcellml::Component::takeVariable(Component *this,size_t index)

{
  ComponentImpl *pCVar1;
  size_type sVar2;
  reference pvVar3;
  ulong in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  VariablePtr VVar5;
  size_t index_local;
  Component *this_local;
  VariablePtr *variable;
  
  std::shared_ptr<libcellml::Variable>::shared_ptr
            ((shared_ptr<libcellml::Variable> *)this,(nullptr_t)0x0);
  pCVar1 = pFunc((Component *)index);
  sVar2 = std::
          vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
          ::size(&pCVar1->mVariables);
  _Var4._M_pi = extraout_RDX;
  if (in_RDX < sVar2) {
    pCVar1 = pFunc((Component *)index);
    pvVar3 = std::
             vector<std::shared_ptr<libcellml::Variable>,_std::allocator<std::shared_ptr<libcellml::Variable>_>_>
             ::at(&pCVar1->mVariables,in_RDX);
    std::shared_ptr<libcellml::Variable>::operator=((shared_ptr<libcellml::Variable> *)this,pvVar3);
    removeVariable((Component *)index,in_RDX);
    _Var4._M_pi = extraout_RDX_00;
  }
  VVar5.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var4._M_pi;
  VVar5.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (VariablePtr)VVar5.super___shared_ptr<libcellml::Variable,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

VariablePtr Component::takeVariable(size_t index)
{
    VariablePtr variable = nullptr;
    if (index < pFunc()->mVariables.size()) {
        variable = pFunc()->mVariables.at(index);
        removeVariable(index);
    }

    return variable;
}